

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printDescription
          (PrinterStream *this,vector<soul::Type,_std::allocator<soul::Type>_> *types)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type *type_00;
  CodePrinter *pCVar2;
  pointer pTVar3;
  bool bVar4;
  size_t sVar5;
  Type *type;
  pointer type_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  char s [2];
  char local_52 [2];
  string local_50;
  
  type_00 = (types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = this->out;
  if ((long)(types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)type_00 == 0x18) {
    getTypeDescription_abi_cxx11_(&local_50,this,type_00);
    text._M_str = local_50._M_dataplus._M_p;
    text._M_len = local_50._M_string_length;
    choc::text::CodePrinter::writeBlock(pCVar2,text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  else {
    local_52[0] = '(';
    local_52[1] = '\0';
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(local_52);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar5);
    choc::text::CodePrinter::append(pCVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    type_01 = (types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pTVar3 = (types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (type_01 != pTVar3) {
      bVar4 = true;
      do {
        if (!bVar4) {
          text_00._M_str = ", ";
          text_00._M_len = 2;
          choc::text::CodePrinter::writeBlock(this->out,text_00);
        }
        pCVar2 = this->out;
        getTypeDescription_abi_cxx11_(&local_50,this,type_01);
        text_01._M_str = local_50._M_dataplus._M_p;
        text_01._M_len = local_50._M_string_length;
        choc::text::CodePrinter::writeBlock(pCVar2,text_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        type_01 = type_01 + 1;
        bVar4 = false;
      } while (type_01 != pTVar3);
    }
    pCVar2 = this->out;
    local_52[0] = ')';
    local_52[1] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(local_52);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar5);
    choc::text::CodePrinter::append(pCVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void printDescription (const std::vector<Type>& types)
        {
            if (types.size() == 1)
            {
                out << getTypeDescription (types[0]);
                return;
            }

            out << '(';
            bool first = true;

            for (auto& type : types)
            {
                if (! first)
                    out << ", ";

                out << getTypeDescription (type);
                first = false;
            }

            out << ')';
        }